

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O3

void qt_fusion_draw_arrow
               (ArrowType type,QPainter *painter,QStyleOption *option,QRect *rect,QColor *color)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  int iVar12;
  undefined1 auVar13 [12];
  int iVar14;
  HexString<unsigned_int> HVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  QSize size;
  int iVar19;
  long in_FS_OFFSET;
  qreal qVar20;
  qreal qVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined4 uVar26;
  double dVar25;
  double dVar27;
  undefined4 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  QColor QVar32;
  QCachedPainter cp;
  QString local_e8;
  undefined1 local_c8 [24];
  Data *pDStack_b0;
  char16_t *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = rect->x1;
  uVar5 = rect->y1;
  uVar2 = rect->x2;
  uVar6 = rect->y2;
  auVar30._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
  auVar30._4_4_ = auVar30._0_4_;
  auVar30._8_4_ = -(uint)((int)uVar6 < (int)uVar5);
  auVar30._12_4_ = -(uint)((int)uVar6 < (int)uVar5);
  iVar14 = movmskpd((int)local_38,auVar30);
  if (iVar14 == 0) {
    qVar20 = QStyleHelper::dpi(option);
    qVar21 = QStyleHelper::dpiScaled(14.0,qVar20);
    qVar20 = QStyleHelper::dpiScaled(8.0,qVar20);
    iVar14 = (rect->y2).m_i;
    iVar9 = (rect->x1).m_i;
    iVar19 = (rect->y1).m_i;
    iVar10 = (rect->x2).m_i;
    local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    HVar15.val = QColor::rgba();
    local_c8._0_8_ = (QPainter *)0xc;
    local_c8._8_8_ = "fusion-arrow";
    local_c8._16_4_ = type;
    pDStack_b0 = (Data *)CONCAT44(pDStack_b0._4_4_,HVar15.val);
    QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
    ::convertTo<QString>
              (&local_e8,
               (QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
                *)local_c8);
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pDStack_b0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    size.wd.m_i = ((rect->x2).m_i - (rect->x1).m_i) + 1;
    size.ht.m_i = ((rect->y2).m_i - (rect->y1).m_i) + 1;
    QCachedPainter::QCachedPainter((QCachedPainter *)local_c8,painter,&local_e8,option,size,*rect);
    if (puStack_70._0_1_ == false) {
      iVar16 = (int)qVar20;
      iVar17 = (int)qVar21;
      iVar12 = iVar17;
      if (iVar16 < iVar17) {
        iVar12 = iVar16;
      }
      iVar19 = (iVar14 - iVar19) + 1;
      iVar14 = (iVar10 - iVar9) + 1;
      if (iVar19 < iVar14) {
        iVar14 = iVar19;
      }
      if (iVar12 < iVar14) {
        iVar14 = iVar12;
      }
      dVar24 = (double)((iVar16 * iVar14) / iVar17);
      dVar27 = (double)iVar14;
      uVar18 = (uint)(type - LeftArrow < 2);
      auVar29._0_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
      auVar29._4_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
      auVar29._8_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
      auVar29._12_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
      uVar26 = (undefined4)((ulong)dVar24 >> 0x20);
      uVar28 = (undefined4)((ulong)dVar27 >> 0x20);
      auVar22._8_4_ = SUB84(dVar27,0);
      auVar22._0_8_ = dVar24;
      auVar22._12_4_ = uVar28;
      auVar11._8_4_ = SUB84(dVar24,0);
      auVar11._0_8_ = dVar27;
      auVar11._12_4_ = uVar26;
      auVar30 = ~auVar29 & auVar11 | auVar22 & auVar29;
      uVar3 = rect->x2;
      uVar7 = rect->y2;
      uVar4 = rect->x1;
      uVar8 = rect->y1;
      dVar25 = auVar30._0_8_;
      dStack_50 = auVar30._8_8_;
      local_68 = ((double)((uVar3 - uVar4) + 1) - dVar25) * 0.5;
      dVar23 = ((double)((uVar7 - uVar8) + 1) - dStack_50) * 0.5;
      dStack_60 = dVar23;
      if (type == RightArrow) {
        dStack_50 = dVar23 + dVar27;
        dVar25 = dVar24 + local_68;
        dVar23 = dVar27 * 0.5 + dVar23;
        local_58 = local_68;
      }
      else if (type == LeftArrow) {
        auVar13._4_8_ = dStack_50;
        auVar13._0_4_ = uVar26;
        auVar31._0_8_ = auVar13._0_8_ << 0x20;
        auVar31._8_4_ = SUB84(dVar27,0);
        auVar31._12_4_ = uVar28;
        dStack_50 = dVar23 + auVar31._8_8_;
        dVar23 = auVar31._8_8_ * 0.5 + dVar23;
        local_58 = local_68 + dVar24;
        dVar25 = local_68;
        local_68 = dVar24 + local_68;
      }
      else if (type == DownArrow) {
        local_58 = local_68 + dVar27;
        dStack_50 = dVar23;
        dVar25 = dVar27 * 0.5 + local_68;
        dVar23 = dVar24 + dVar23;
      }
      else {
        dStack_50 = dStack_50 + dVar23;
        local_58 = dVar25 + local_68;
        dStack_60 = dStack_50;
        dVar25 = local_68 + dVar25 * 0.5;
      }
      local_48._8_4_ = SUB84(dVar23,0);
      local_48._0_8_ = dVar25;
      local_48._12_4_ = (int)((ulong)dVar23 >> 0x20);
      QPainter::setPen((PenStyle)local_c8._16_8_);
      QVar32._8_8_ = *(undefined8 *)color;
      QVar32._0_8_ = local_c8._16_8_;
      QPainter::setBrush(QVar32);
      QPainter::setRenderHint((RenderHint)local_c8._16_8_,true);
      QPainter::drawPolygon((QPointF *)local_c8._16_8_,(int)&local_68,3);
    }
    QCachedPainter::~QCachedPainter((QCachedPainter *)local_c8);
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_fusion_draw_arrow(Qt::ArrowType type, QPainter *painter, const QStyleOption *option, const QRect &rect, const QColor &color)
{
    if (rect.isEmpty())
        return;

    const qreal dpi = QStyleHelper::dpi(option);
    const int arrowWidth = int(QStyleHelper::dpiScaled(14, dpi));
    const int arrowHeight = int(QStyleHelper::dpiScaled(8, dpi));

    const int arrowMax = qMin(arrowHeight, arrowWidth);
    const int rectMax = qMin(rect.height(), rect.width());
    const int size = qMin(arrowMax, rectMax);

    const QString pixmapName = "fusion-arrow"_L1
                               % HexString<uint>(type)
                               % HexString<uint>(color.rgba());
    QCachedPainter cp(painter, pixmapName, option, rect.size(), rect);
    if (cp.needsPainting()) {
        QRectF arrowRect(0, 0, size, arrowHeight * size / arrowWidth);
        if (type == Qt::LeftArrow || type == Qt::RightArrow)
            arrowRect = arrowRect.transposed();
        arrowRect.moveTo((rect.width() - arrowRect.width()) / 2.0,
                         (rect.height() - arrowRect.height()) / 2.0);

        std::array<QPointF, 3> triangle;
        switch (type) {
        case Qt::DownArrow:
            triangle = {arrowRect.topLeft(), arrowRect.topRight(), QPointF(arrowRect.center().x(), arrowRect.bottom())};
            break;
        case Qt::RightArrow:
            triangle = {arrowRect.topLeft(), arrowRect.bottomLeft(), QPointF(arrowRect.right(), arrowRect.center().y())};
            break;
        case Qt::LeftArrow:
            triangle = {arrowRect.topRight(), arrowRect.bottomRight(), QPointF(arrowRect.left(), arrowRect.center().y())};
            break;
        default:
            triangle = {arrowRect.bottomLeft(), arrowRect.bottomRight(), QPointF(arrowRect.center().x(), arrowRect.top())};
            break;
        }

        cp->setPen(Qt::NoPen);
        cp->setBrush(color);
        cp->setRenderHint(QPainter::Antialiasing);
        cp->drawPolygon(triangle.data(), int(triangle.size()));
    }
}